

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O0

pool_ptr<soul::Module> __thiscall
soul::Program::ProgramImpl::findModuleWithName(ProgramImpl *this,string *name)

{
  bool bVar1;
  __type_conflict1 _Var2;
  reference this_00;
  Module *pMVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  pool_ref<soul::Module> *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range2;
  string *name_local;
  ProgramImpl *this_local;
  
  __end2 = std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ::begin((vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                    *)(name + 2));
  m = (pool_ref<soul::Module> *)
      std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::end
                ((vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                  *)(name + 2));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                                *)&m);
    if (!bVar1) {
      pool_ptr<soul::Module>::pool_ptr((pool_ptr<soul::Module> *)this);
      return (pool_ptr<soul::Module>)(Module *)this;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
              ::operator*(&__end2);
    pMVar3 = pool_ref<soul::Module>::operator->(this_00);
    _Var2 = std::operator==(&pMVar3->fullName,in_RDX);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
    ::operator++(&__end2);
  }
  pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
  return (pool_ptr<soul::Module>)(Module *)this;
}

Assistant:

pool_ptr<Module> findModuleWithName (const std::string& name) const
    {
        for (auto& m : modules)
            if (m->fullName == name)
                return m;

        return {};
    }